

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O3

Node * __thiscall
leveldb::SkipList<unsigned_long,_leveldb::Comparator>::FindLessThan
          (SkipList<unsigned_long,_leveldb::Comparator> *this,unsigned_long *key)

{
  Node *pNVar1;
  Node *pNVar2;
  uint uVar3;
  Node *pNVar4;
  
  pNVar4 = this->head_;
  uVar3 = (this->max_height_).super___atomic_base<int>._M_i - 1;
  pNVar1 = pNVar4;
  while ((pNVar1 == pNVar4 || (pNVar1->key < *key))) {
    if ((int)uVar3 < 0) {
      __assert_fail("n >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/skiplist.h"
                    ,0x9a,
                    "Node *leveldb::SkipList<unsigned long, leveldb::Comparator>::Node::Next(int) [Key = unsigned long, Comparator = leveldb::Comparator]"
                   );
    }
    pNVar2 = pNVar1->next_[uVar3]._M_b._M_p;
    if ((pNVar2 == (Node *)0x0) || (*key <= pNVar2->key)) {
      if (uVar3 == 0) {
        return pNVar1;
      }
      uVar3 = uVar3 - 1;
      pNVar2 = pNVar1;
    }
    pNVar4 = this->head_;
    pNVar1 = pNVar2;
  }
  __assert_fail("x == head_ || compare_(x->key, key) < 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/skiplist.h"
                ,0x121,
                "typename SkipList<Key, Comparator>::Node *leveldb::SkipList<unsigned long, leveldb::Comparator>::FindLessThan(const Key &) const [Key = unsigned long, Comparator = leveldb::Comparator]"
               );
}

Assistant:

typename SkipList<Key, Comparator>::Node*
SkipList<Key, Comparator>::FindLessThan(const Key& key) const {
  Node* x = head_;
  int level = GetMaxHeight() - 1;
  while (true) {
    assert(x == head_ || compare_(x->key, key) < 0);
    Node* next = x->Next(level);
    if (next == nullptr || compare_(next->key, key) >= 0) {
      if (level == 0) {
        return x;
      } else {
        // Switch to next list
        level--;
      }
    } else {
      x = next;
    }
  }
}